

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O0

void __thiscall StreamSummary<4U>::Add_Counter(StreamSummary<4U> *this,Data<4U> *data,bool empty)

{
  StreamCounter *pSVar1;
  Node<int> *pNVar2;
  mapped_type pSVar3;
  mapped_type *ppSVar4;
  StreamBucket *pSVar5;
  byte in_DL;
  undefined4 *in_RSI;
  StreamSummary<4U> *in_RDI;
  StreamBucket *bucket;
  StreamCounter *temp;
  StreamCounter *add;
  StreamBucket *prev;
  key_type *in_stack_ffffffffffffff78;
  unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
  *in_stack_ffffffffffffff80;
  StreamCounter *in_stack_ffffffffffffff88;
  StreamCounter *pSVar6;
  undefined8 in_stack_ffffffffffffff90;
  Data<4U> _ID;
  StreamCounter *in_stack_ffffffffffffffc0;
  StreamBucket *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar7;
  
  _ID.str = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  pSVar3 = (mapped_type)operator_new(0x20);
  uVar7 = *in_RSI;
  StreamCounter::StreamCounter(in_stack_ffffffffffffff88,_ID);
  Add_Bucket((StreamSummary<4U> *)CONCAT44(uVar7,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  ppSVar4 = std::
            unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
            ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *ppSVar4 = pSVar3;
  if ((in_DL & 1) == 0) {
    pSVar5 = Min_Bucket(in_RDI);
    pSVar1 = pSVar5->child;
    pSVar6 = (StreamCounter *)(pSVar1->super_Node<Data<4U>_>).next;
    pSVar5 = Min_Bucket(in_RDI);
    pSVar5->child = pSVar6;
    std::
    unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
    ::erase(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Node<Data<4U>_>::Delete((Node<Data<4U>_> *)0x115496);
    if ((pSVar1->super_Node<Data<4U>_>).next == (Node<Data<4U>_> *)0x0) {
      pNVar2 = (in_RDI->min_bucket->super_Node<int>).next;
      Node<int>::Delete((Node<int> *)0x1154be);
      if (pNVar2 != (Node<int> *)0x0) {
        operator_delete(pNVar2,0x20);
      }
    }
    if (pSVar1 != (StreamCounter *)0x0) {
      operator_delete(pSVar1,0x20);
    }
  }
  return;
}

Assistant:

void Add_Counter(const Data<DATA_LEN>& data, bool empty) {
		StreamBucket* prev = empty ? min_bucket : (StreamBucket*)min_bucket->next;

		StreamCounter* add = new StreamCounter(data);
		Add_Bucket(prev, add);
		mp[data] = add;

		if (!empty) {
			StreamCounter* temp = Min_Bucket()->child;
			Min_Bucket()->child = (StreamCounter*)temp->next;
			mp.erase(temp->ID);
			temp->Delete();
			if (temp->next == NULL) {
				StreamBucket* bucket = (StreamBucket*)min_bucket->next;
				bucket->Delete();
				delete bucket;
			}
			delete temp;
		}
	}